

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3TokenizerFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Fts3Hash *pH;
  void *data;
  int iVar1;
  int iVar2;
  void *pvVar3;
  Fts3HashElem *pFVar4;
  undefined8 *puVar5;
  char *pcVar6;
  Mem *pMem;
  void *pPtr;
  int isEnabled;
  void *local_40;
  int local_34;
  
  local_40 = (void *)0x0;
  pH = (Fts3Hash *)context->pFunc->pUserData;
  pvVar3 = sqlite3ValueText(*argv,'\x01');
  iVar1 = sqlite3ValueBytes(*argv,'\x01');
  if (argc == 2) {
    local_34 = 0;
    sqlite3_db_config(context->pOut->db,0x3ec,0xffffffff,&local_34);
    if ((local_34 == 0) && ((argv[1]->flags & 0x20) == 0)) {
      context->isError = 1;
      pMem = context->pOut;
      pcVar6 = "fts3tokenize disabled";
    }
    else {
      iVar2 = sqlite3ValueBytes(argv[1],'\x01');
      if ((pvVar3 != (void *)0x0) && (iVar2 == 8)) {
        puVar5 = (undefined8 *)sqlite3_value_blob(argv[1]);
        data = (void *)*puVar5;
        local_40 = data;
        pvVar3 = sqlite3Fts3HashInsert(pH,pvVar3,iVar1 + 1,data);
        if (pvVar3 == data) {
          context->isError = 1;
          sqlite3VdbeMemSetStr
                    (context->pOut,"out of memory",-1,'\x01',
                     (_func_void_void_ptr *)0xffffffffffffffff);
        }
        goto LAB_001b89db;
      }
      context->isError = 1;
      pMem = context->pOut;
      pcVar6 = "argument type mismatch";
    }
    sqlite3VdbeMemSetStr(pMem,pcVar6,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    if (pvVar3 == (void *)0x0) {
LAB_001b8925:
      pcVar6 = sqlite3_mprintf("unknown tokenizer: %s",pvVar3);
      context->isError = 1;
      sqlite3VdbeMemSetStr(context->pOut,pcVar6,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
      ;
      sqlite3_free(pcVar6);
      return;
    }
    pFVar4 = sqlite3Fts3HashFindElem(pH,pvVar3,iVar1 + 1);
    if ((pFVar4 == (Fts3HashElem *)0x0) || (local_40 = pFVar4->data, local_40 == (void *)0x0))
    goto LAB_001b8925;
LAB_001b89db:
    local_34 = 0;
    sqlite3_db_config(context->pOut->db,0x3ec,0xffffffff);
    if ((local_34 != 0) || (((*argv)->flags & 0x20) != 0)) {
      setResultStrOrError(context,(char *)&local_40,8,'\0',(_func_void_void_ptr *)0xffffffffffffffff
                         );
    }
  }
  return;
}

Assistant:

static void fts3TokenizerFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  Fts3Hash *pHash;
  void *pPtr = 0;
  const unsigned char *zName;
  int nName;

  assert( argc==1 || argc==2 );

  pHash = (Fts3Hash *)sqlite3_user_data(context);

  zName = sqlite3_value_text(argv[0]);
  nName = sqlite3_value_bytes(argv[0])+1;

  if( argc==2 ){
    if( fts3TokenizerEnabled(context) || sqlite3_value_frombind(argv[1]) ){
      void *pOld;
      int n = sqlite3_value_bytes(argv[1]);
      if( zName==0 || n!=sizeof(pPtr) ){
        sqlite3_result_error(context, "argument type mismatch", -1);
        return;
      }
      pPtr = *(void **)sqlite3_value_blob(argv[1]);
      pOld = sqlite3Fts3HashInsert(pHash, (void *)zName, nName, pPtr);
      if( pOld==pPtr ){
        sqlite3_result_error(context, "out of memory", -1);
      }
    }else{
      sqlite3_result_error(context, "fts3tokenize disabled", -1);
      return;
    }
  }else{
    if( zName ){
      pPtr = sqlite3Fts3HashFind(pHash, zName, nName);
    }
    if( !pPtr ){
      char *zErr = sqlite3_mprintf("unknown tokenizer: %s", zName);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
  }
  if( fts3TokenizerEnabled(context) || sqlite3_value_frombind(argv[0]) ){
    sqlite3_result_blob(context, (void *)&pPtr, sizeof(pPtr), SQLITE_TRANSIENT);
  }
}